

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wcpcpy_s.c
# Opt level: O0

wchar_t * wcpcpy_s(wchar_t *dest,rsize_t dmax,wchar_t *src,errno_t *err)

{
  long lVar1;
  undefined4 *in_RCX;
  wchar_t *in_RDX;
  long in_RSI;
  wchar_t *in_RDI;
  long in_FS_OFFSET;
  bool bVar2;
  wchar_t *overlap_bumper;
  wchar_t *orig_dest;
  rsize_t orig_dmax;
  char *in_stack_ffffffffffffffa8;
  errno_t error;
  uint7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  char *in_stack_ffffffffffffffb8;
  wchar_t *local_28;
  long local_20;
  wchar_t *local_18;
  wchar_t *local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  error = (errno_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  if (in_RDI == (wchar_t *)0x0) {
    invoke_safe_str_constraint_handler
              (in_stack_ffffffffffffffb8,
               (void *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),error);
    *in_RCX = 400;
    local_10 = (wchar_t *)0x0;
  }
  else if (in_RSI == 0) {
    invoke_safe_str_constraint_handler
              (in_stack_ffffffffffffffb8,
               (void *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),error);
    *in_RCX = 0x191;
    local_10 = (wchar_t *)0x0;
  }
  else if ((ulong)(in_RSI << 2) < 0x10000001) {
    if (in_RDX == (wchar_t *)0x0) {
      *in_RDI = L'\0';
      invoke_safe_str_constraint_handler
                (in_stack_ffffffffffffffb8,
                 (void *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),error);
      *in_RCX = 400;
      local_10 = (wchar_t *)0x0;
    }
    else {
      local_20 = in_RSI;
      local_18 = in_RDI;
      if (in_RDI == in_RDX) {
        while( true ) {
          bVar2 = false;
          if (local_20 != 0) {
            bVar2 = *local_18 != L'\0';
          }
          if (!bVar2) break;
          local_20 = local_20 + -1;
          local_18 = local_18 + 1;
        }
        if (*local_18 == L'\0') {
          *in_RCX = 0;
          local_10 = local_18;
        }
        else {
          invoke_safe_str_constraint_handler
                    (in_stack_ffffffffffffffb8,(void *)(ulong)in_stack_ffffffffffffffb0,error);
          *in_RCX = 0x193;
          local_10 = (wchar_t *)0x0;
        }
      }
      else {
        local_28 = in_RDX;
        if (in_RDI < in_RDX) {
          for (; local_20 != 0; local_20 = local_20 + -1) {
            if (local_18 == in_RDX) {
              handle_wc_error(in_RDX,CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                              in_stack_ffffffffffffffa8,0);
              *in_RCX = 0x194;
              local_10 = (wchar_t *)0x0;
              goto LAB_0010d840;
            }
            *local_18 = *local_28;
            if (*local_18 == L'\0') {
              *in_RCX = 0;
              local_10 = local_18;
              goto LAB_0010d840;
            }
            local_18 = local_18 + 1;
            local_28 = local_28 + 1;
          }
        }
        else {
          for (; in_RDX = in_RDI, local_20 != 0; local_20 = local_20 + -1) {
            if (local_28 == in_RDI) {
              handle_wc_error(in_RDI,CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                              in_stack_ffffffffffffffa8,0);
              *in_RCX = 0x194;
              local_10 = (wchar_t *)0x0;
              goto LAB_0010d840;
            }
            *local_18 = *local_28;
            if (*local_18 == L'\0') {
              *in_RCX = 0;
              local_10 = local_18;
              goto LAB_0010d840;
            }
            local_18 = local_18 + 1;
            local_28 = local_28 + 1;
          }
        }
        handle_wc_error(in_RDX,CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                        in_stack_ffffffffffffffa8,0);
        *in_RCX = 0x196;
        local_10 = (wchar_t *)0x0;
      }
    }
  }
  else {
    invoke_safe_str_constraint_handler
              (in_stack_ffffffffffffffb8,
               (void *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),error);
    *in_RCX = 0x193;
    local_10 = (wchar_t *)0x0;
  }
LAB_0010d840:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

wchar_t *
wcpcpy_s(wchar_t* dest, rsize_t dmax, const wchar_t* src, errno_t *err)
{
    rsize_t orig_dmax;
    wchar_t *orig_dest;
    const wchar_t *overlap_bumper;

    if (dest == NULL) {
        invoke_safe_str_constraint_handler("wcpcpy_s: dest is null",
                   NULL, ESNULLP);
        *err = RCNEGATE(ESNULLP);
        return NULL;
    }

    if (dmax == 0) {
        invoke_safe_str_constraint_handler("wcpcpy_s: dmax is 0",
                   NULL, ESZEROL);
        *err = RCNEGATE(ESZEROL);
        return NULL;
    }

    if (dmax*sizeof(wchar_t) > RSIZE_MAX_STR) {
        invoke_safe_str_constraint_handler("wcpcpy_s: dmax exceeds max",
                   NULL, ESLEMAX);
        *err = RCNEGATE(ESLEMAX);
        return NULL;
    }

    if (src == NULL) {
#ifdef SAFECLIB_STR_NULL_SLACK
        /* null string to clear data */
        while (dmax) {  *dest = L'\0'; dmax--; dest++; }
#else
        *dest = L'\0';
#endif
        invoke_safe_str_constraint_handler("wcpcpy_s: src is null",
                   NULL, ESNULLP);
        *err = RCNEGATE(ESNULLP);
        return NULL;
    }

    if (dest == src) {
        /* move dest to the end of the string */
        while (dmax && (*dest != L'\0')) { dmax--; dest++; }
        if ( *dest != L'\0' ) {
            invoke_safe_str_constraint_handler("wcpcpy_s: no null terminator in dest",
                               NULL, ESLEMAX);
            *err = RCNEGATE(ESLEMAX);
            return NULL;
        }
        *err = RCNEGATE(EOK);
        return dest;
    }

    /* hold base of dest in case src was not copied */
    orig_dmax = dmax;
    orig_dest = dest;

    if (dest < src) {
        overlap_bumper = src;

        while (dmax > 0) {
            if (dest == overlap_bumper) {
                handle_wc_error(orig_dest, orig_dmax, "wcpcpy_s: overlapping objects",
                             ESOVRLP);
                *err = RCNEGATE(ESOVRLP);
                return NULL;
            }

            *dest = *src;
            if (*dest == L'\0') {
#ifdef SAFECLIB_STR_NULL_SLACK
                /* null slack to clear any data */
                while (dmax) { *dest = L'\0'; dmax--; dest++; }
#endif
                *err = RCNEGATE(EOK);
                return dest; /* successful return */
            }

            dmax--;
            dest++;
            src++;
        }

    } else {
        overlap_bumper = dest;

        while (dmax > 0) {
            if (src == overlap_bumper) {
                handle_wc_error(orig_dest, orig_dmax, "wcpcpy_s: overlapping objects",
                      ESOVRLP);
                *err = RCNEGATE(ESOVRLP);
                return NULL;
            }

            *dest = *src;
            if (*dest == L'\0') {
#ifdef SAFECLIB_STR_NULL_SLACK
                /* null slack to clear any data */
                while (dmax) { *dest = L'\0'; dmax--; dest++; }
#endif
                *err = RCNEGATE(EOK);
                return dest; /* successful return */
            }

            dmax--;
            dest++;
            src++;
        }
    }

    /*
     * the entire src must have been copied, if not reset dest
     * to null the string.
     */
    handle_wc_error(orig_dest, orig_dmax, "wcpcpy_s: not enough space for src",
                 ESNOSPC);
    *err = RCNEGATE(ESNOSPC);
    return NULL;
}